

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O2

void __thiscall
irr::gui::CGUIFileOpenDialog::~CGUIFileOpenDialog(CGUIFileOpenDialog *this,void **vtt)

{
  void *pvVar1;
  IGUIButton *pIVar2;
  IGUIListBox *pIVar3;
  IGUIEditBox *pIVar4;
  IFileList *pIVar5;
  IFileSystem *pIVar6;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[5];
  pIVar2 = this->CloseButton;
  if (pIVar2 != (IGUIButton *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] +
               (long)&(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver));
  }
  pIVar2 = this->OKButton;
  if (pIVar2 != (IGUIButton *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] +
               (long)&(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver));
  }
  pIVar2 = this->CancelButton;
  if (pIVar2 != (IGUIButton *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] +
               (long)&(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver));
  }
  pIVar3 = this->FileBox;
  if (pIVar3 != (IGUIListBox *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((pIVar3->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] +
               (long)&(pIVar3->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver));
  }
  pIVar4 = this->FileNameText;
  if (pIVar4 != (IGUIEditBox *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((pIVar4->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] +
               (long)&(pIVar4->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver));
  }
  pIVar6 = this->FileSystem;
  if (pIVar6 != (IFileSystem *)0x0) {
    if ((int)(this->RestoreDirectory).str._M_string_length != 0) {
      (*pIVar6->_vptr_IFileSystem[0x12])(pIVar6,&this->RestoreDirectory);
      pIVar6 = this->FileSystem;
    }
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar6->_vptr_IFileSystem + (long)pIVar6->_vptr_IFileSystem[-3]));
  }
  pIVar5 = this->FileList;
  if (pIVar5 != (IFileList *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar5->_vptr_IFileList + (long)pIVar5->_vptr_IFileList[-3]));
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::wstring::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::wstring::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  IGUIElement::~IGUIElement((IGUIElement *)this,vtt + 2);
  return;
}

Assistant:

CGUIFileOpenDialog::~CGUIFileOpenDialog()
{
	if (CloseButton)
		CloseButton->drop();

	if (OKButton)
		OKButton->drop();

	if (CancelButton)
		CancelButton->drop();

	if (FileBox)
		FileBox->drop();

	if (FileNameText)
		FileNameText->drop();

	if (FileSystem) {
		// revert to original CWD if path was set in constructor
		if (RestoreDirectory.size())
			FileSystem->changeWorkingDirectoryTo(RestoreDirectory);
		FileSystem->drop();
	}

	if (FileList)
		FileList->drop();
}